

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

ecvt_result * mjs::anon_unknown_1::do_ecvt(ecvt_result *__return_storage_ptr__,double m,int k)

{
  long lVar1;
  char cVar2;
  uint __line;
  ulong uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char temp [32];
  
  if (k < 1) {
    pcVar6 = "k >= 1";
    __line = 0x12;
  }
  else {
    __return_storage_ptr__->k = k;
    snprintf(temp,0x20,"%1.*e",(ulong)(k - 1U));
    __return_storage_ptr__->s[0] = temp[0];
    if (k != 1) {
      if (temp[1] != '.') {
        pcVar6 = "temp[1] == \'.\'";
        __line = 0x1b;
        goto LAB_00142f3f;
      }
      memcpy(__return_storage_ptr__->s + 1,temp + 2,(ulong)(k - 1U));
    }
    uVar3 = (ulong)(uint)k;
    if (temp[uVar3 + (k != 1)] == 'e') {
      lVar1 = uVar3 + (k != 1);
      cVar2 = temp[lVar1 + 1];
      if ((cVar2 == '-') || (cVar2 == '+')) {
        pcVar6 = temp + lVar1 + 1;
        iVar4 = 0;
        while( true ) {
          pcVar6 = pcVar6 + 1;
          if (*pcVar6 == '\0') break;
          iVar4 = iVar4 * 10 + (int)*pcVar6 + -0x30;
        }
        iVar5 = -iVar4;
        if (cVar2 != '-') {
          iVar5 = iVar4;
        }
        __return_storage_ptr__->n = iVar5 + 1;
        __return_storage_ptr__->s[uVar3] = '\0';
        return __return_storage_ptr__;
      }
    }
    pcVar6 = "exp[-1] == \'e\' && (exp[0] == \'+\' || exp[0] == \'-\')";
    __line = 0x1f;
  }
LAB_00142f3f:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,__line,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
}

Assistant:

ecvt_result do_ecvt(double m, int k) {
    assert(k >= 1); // k is the number of decimal digits in the representation

    ecvt_result res;
    res.k = k;
#if 1
    char temp[32];
    snprintf(temp, sizeof(temp), "%1.*e", k-1, m);
    res.s[0] = temp[0];
    if (k > 1) {
        assert(temp[1] == '.');
        std::memcpy(&res.s[1], &temp[2], k-1);
    }
    const char* exp = &temp[k+(k>1)+1];
    assert(exp[-1] == 'e' && (exp[0] == '+' || exp[0] == '-'));
    res.n = 0;
    for (int i = 1; exp[i]; ++i) {
        res.n = res.n*10 + exp[i] - '0';
    }
    if (exp[0] == '-') {
        res.n = -res.n;
    }
    ++res.n; // Adjust for "1." format part
#else
    int sign;                   // sign is set if the value is negative (never true since to_string handles that)
#ifdef _MSC_VER
    char s[_CVTBUFSIZE + 1];    // s is the decimal representation of the number
    _ecvt_s(s, m, k, &res.n, &sign);
#else
    const char* s = ecvt(m, k, &res.n, &sign);
#endif
    assert(sign == 0);
    assert((int)std::strlen(s) == k);
    std::memcpy(res.s, s, k);
#endif
    res.s[k] = '\0';
    return res;
}